

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O0

string * soul::CompileMessageHelpers::replaceArgument
                   (string *__return_storage_ptr__,string *text,size_t index,string *value)

{
  string_view firstReplacement;
  string_view firstReplacement_00;
  char *pcVar1;
  string_view firstToReplace;
  string_view firstToReplace_00;
  size_t in_stack_fffffffffffffe28;
  string *this;
  string *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [16];
  string local_158 [32];
  string local_138;
  string local_118;
  undefined1 local_f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [16];
  string local_88 [32];
  string local_68;
  undefined1 local_48 [8];
  string i;
  string *value_local;
  size_t index_local;
  string *text_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  i.field_2._8_8_ = value;
  std::__cxx11::to_string((string *)local_48,index);
  std::__cxx11::string::string(local_88,(string *)text);
  std::operator+(&local_e8,"$Q",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_c8,&local_e8,"$");
  local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_138,(string *)i.field_2._8_8_);
  choc::text::addSingleQuotes(&local_118,&local_138);
  local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_118);
  firstReplacement._M_str = (char *)__return_storage_ptr___00;
  firstReplacement._M_len = in_stack_fffffffffffffe28;
  firstToReplace._M_str = local_f8._0_8_;
  firstToReplace._M_len = local_a8._8_8_;
  choc::text::replace<std::__cxx11::string>
            (&local_68,(text *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_,
             firstToReplace,firstReplacement);
  this = &local_68;
  std::__cxx11::string::operator=((string *)text,(string *)this);
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::string(local_158,(string *)text);
  std::operator+(&local_1a8,"$",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_188,&local_1a8,"$");
  local_168 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_188);
  pcVar1 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)i.field_2._8_8_);
  firstReplacement_00._M_str = (char *)__return_storage_ptr___00;
  firstReplacement_00._M_len = (size_t)this;
  firstToReplace_00._M_str = pcVar1;
  firstToReplace_00._M_len = local_168._8_8_;
  choc::text::replace<std::__cxx11::string>
            (__return_storage_ptr___00,(text *)local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_,
             firstToReplace_00,firstReplacement_00);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::string replaceArgument (std::string text, size_t index, const std::string& value)
    {
        auto i = std::to_string (index);
        text = choc::text::replace (text, "$Q" + i + "$", choc::text::addSingleQuotes (value));
        return choc::text::replace (text, "$" + i + "$", value);
    }